

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

IVec4 __thiscall tcu::getTextureFormatMantissaBitDepth(tcu *this,TextureFormat *format)

{
  deBool dVar1;
  deBool dVar2;
  deBool dVar3;
  deBool dVar4;
  int b;
  int c;
  int d;
  bool *pbVar5;
  Vector<int,_4> VVar6;
  IVec4 IVar7;
  Channel local_94;
  Channel local_8c;
  Channel local_84;
  Channel local_7c;
  Vector<int,_4> local_64;
  Vector<int,_4> local_54;
  undefined1 local_44 [8];
  IVec4 chnSwz;
  BVec4 chnMask;
  Channel *map;
  IVec4 chnBits;
  TextureFormat *format_local;
  
  chnBits.m_data._8_8_ = format;
  getChannelMantissaBitDepth((tcu *)&map,format->type);
  register0x00000000 = getChannelReadSwizzle(*(ChannelOrder *)chnBits.m_data._8_8_);
  dVar1 = deInRange32(register0x00000000->components[0],0,3);
  dVar2 = deInRange32(stack0xffffffffffffffd0->components[1],0,3);
  dVar3 = deInRange32(stack0xffffffffffffffd0->components[2],0,3);
  dVar4 = deInRange32(stack0xffffffffffffffd0->components[3],0,3);
  Vector<bool,_4>::Vector
            ((Vector<bool,_4> *)(chnSwz.m_data + 2),dVar1 == 1,dVar2 == 1,dVar3 == 1,dVar4 == 1);
  pbVar5 = Vector<bool,_4>::operator[]((Vector<bool,_4> *)(chnSwz.m_data + 2),0);
  if ((*pbVar5 & 1U) == 0) {
    local_7c = CHANNEL_0;
  }
  else {
    local_7c = stack0xffffffffffffffd0->components[0];
  }
  pbVar5 = Vector<bool,_4>::operator[]((Vector<bool,_4> *)(chnSwz.m_data + 2),1);
  if ((*pbVar5 & 1U) == 0) {
    local_84 = CHANNEL_0;
  }
  else {
    local_84 = stack0xffffffffffffffd0->components[1];
  }
  pbVar5 = Vector<bool,_4>::operator[]((Vector<bool,_4> *)(chnSwz.m_data + 2),2);
  if ((*pbVar5 & 1U) == 0) {
    local_8c = CHANNEL_0;
  }
  else {
    local_8c = stack0xffffffffffffffd0->components[2];
  }
  pbVar5 = Vector<bool,_4>::operator[]((Vector<bool,_4> *)(chnSwz.m_data + 2),3);
  if ((*pbVar5 & 1U) == 0) {
    local_94 = CHANNEL_0;
  }
  else {
    local_94 = stack0xffffffffffffffd0->components[3];
  }
  Vector<int,_4>::Vector((Vector<int,_4> *)local_44,local_7c,local_84,local_8c,local_94);
  b = Vector<int,_4>::x((Vector<int,_4> *)local_44);
  c = Vector<int,_4>::y((Vector<int,_4> *)local_44);
  d = Vector<int,_4>::z((Vector<int,_4> *)local_44);
  Vector<int,_4>::w((Vector<int,_4> *)local_44);
  Vector<int,_4>::swizzle(&local_54,(int)&map,b,c,d);
  Vector<int,_4>::Vector(&local_64,0);
  VVar6 = select<int,4>(this,&local_54,&local_64,(Vector<bool,_4> *)(chnSwz.m_data + 2));
  IVar7.m_data._8_8_ = VVar6.m_data._8_8_;
  IVar7.m_data._0_8_ = this;
  return (IVec4)IVar7.m_data;
}

Assistant:

IVec4 getTextureFormatMantissaBitDepth (const TextureFormat& format)
{
	const IVec4						chnBits		= getChannelMantissaBitDepth(format.type);
	const TextureSwizzle::Channel*	map			= getChannelReadSwizzle(format.order).components;
	const BVec4						chnMask		= BVec4(deInRange32(map[0], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[1], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[2], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[3], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE);
	const IVec4						chnSwz		= IVec4((chnMask[0]) ? ((int)map[0]) : (0),
														(chnMask[1]) ? ((int)map[1]) : (0),
														(chnMask[2]) ? ((int)map[2]) : (0),
														(chnMask[3]) ? ((int)map[3]) : (0));

	return select(chnBits.swizzle(chnSwz.x(), chnSwz.y(), chnSwz.z(), chnSwz.w()), IVec4(0), chnMask);
}